

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaTargetGenerator::GetTargetOutputDir
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *config)

{
  string *psVar1;
  string dir;
  string sStack_38;
  
  cmGeneratorTarget::GetDirectory
            (&sStack_38,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,
             RuntimeBinaryArtifact);
  psVar1 = ConvertToNinjaPath(this,&sStack_38);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetTargetOutputDir(
  const std::string& config) const
{
  std::string dir = this->GeneratorTarget->GetDirectory(config);
  return this->ConvertToNinjaPath(dir);
}